

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::CropResizeLayerParams::InternalSwap
          (CropResizeLayerParams *this,CropResizeLayerParams *other)

{
  float fVar1;
  bool bVar2;
  int iVar3;
  SamplingMode *pSVar4;
  BoxCoordinatesMode *pBVar5;
  
  google::protobuf::RepeatedField<unsigned_long>::InternalSwap
            (&this->targetsize_,&other->targetsize_);
  pSVar4 = this->mode_;
  this->mode_ = other->mode_;
  other->mode_ = pSVar4;
  pBVar5 = this->boxindicesmode_;
  this->boxindicesmode_ = other->boxindicesmode_;
  other->boxindicesmode_ = pBVar5;
  bVar2 = this->normalizedcoordinates_;
  this->normalizedcoordinates_ = other->normalizedcoordinates_;
  other->normalizedcoordinates_ = bVar2;
  fVar1 = this->spatialscale_;
  this->spatialscale_ = other->spatialscale_;
  other->spatialscale_ = fVar1;
  iVar3 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar3;
  return;
}

Assistant:

void CropResizeLayerParams::InternalSwap(CropResizeLayerParams* other) {
  targetsize_.InternalSwap(&other->targetsize_);
  std::swap(mode_, other->mode_);
  std::swap(boxindicesmode_, other->boxindicesmode_);
  std::swap(normalizedcoordinates_, other->normalizedcoordinates_);
  std::swap(spatialscale_, other->spatialscale_);
  std::swap(_cached_size_, other->_cached_size_);
}